

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O0

void __thiscall Liby::Poller::runNextTickHandlers(Poller *this)

{
  bool bVar1;
  reference this_00;
  function<void_()> *handler;
  iterator __end1;
  iterator __begin1;
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range1;
  Poller *this_local;
  
  bVar1 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
          empty(&this->nextTickHandlers_);
  if (!bVar1) {
    __end1 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
             begin(&this->nextTickHandlers_);
    handler = (function<void_()> *)
              std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
              end(&this->nextTickHandlers_);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&handler), bVar1) {
      this_00 = std::_List_iterator<std::function<void_()>_>::operator*(&__end1);
      std::function<void_()>::operator()(this_00);
      std::_List_iterator<std::function<void_()>_>::operator++(&__end1);
    }
    std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::clear
              (&this->nextTickHandlers_);
  }
  return;
}

Assistant:

void Poller::runNextTickHandlers() {
    if (nextTickHandlers_.empty())
        return;
    for (auto &handler : nextTickHandlers_)
        handler();
    nextTickHandlers_.clear();
}